

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool comparesEqual(QDir *lhs,QDir *rhs)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  compare_eq_result_container<QList<QString>,_QString> cVar4;
  int iVar5;
  int iVar6;
  QDirPrivate *pQVar7;
  QDirPrivate *this;
  pointer pQVar8;
  long in_FS_OFFSET;
  bool thisCaseSensitive;
  CaseSensitivity sensitive;
  QDirPrivate *other;
  QDirPrivate *d;
  QString otherFilePath;
  QString thisFilePath;
  QOrderedMutexLocker locker;
  undefined4 in_stack_fffffffffffffeb8;
  CaseSensitivity in_stack_fffffffffffffebc;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  QFileSystemEntry *in_stack_fffffffffffffec8;
  QString *this_00;
  pointer in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  uint uVar9;
  undefined4 in_stack_fffffffffffffeec;
  QOrderedMutexLocker *in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef8;
  uint uVar10;
  byte local_d9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = QSharedDataPointer<QDirPrivate>::constData((QSharedDataPointer<QDirPrivate> *)0x281490);
  this = QSharedDataPointer<QDirPrivate>::constData((QSharedDataPointer<QDirPrivate> *)0x28149f);
  if (pQVar7 == this) {
    local_d9 = 1;
    goto LAB_00281988;
  }
  uVar10 = 0xaaaaaaaa;
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x2814d0);
  if ((bVar2) &&
     (bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                          *)0x2814e4), bVar2)) {
    pQVar8 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x281647);
    iVar6 = (*pQVar8->_vptr_QAbstractFileEngine[0x12])();
    pQVar8 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x28166a);
    iVar5 = (*pQVar8->_vptr_QAbstractFileEngine[0x12])();
    if (((byte)iVar6 & 1) != ((byte)iVar5 & 1)) {
      local_d9 = 0;
      goto LAB_00281988;
    }
    pQVar8 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x28169e);
    uVar10 = (*pQVar8->_vptr_QAbstractFileEngine[0x12])();
    uVar10 = (uint)((uVar10 & 1) != 0);
  }
  else {
    in_stack_fffffffffffffee0 =
         std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::get
                   ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                    CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    pQVar8 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::get
                       ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    if (in_stack_fffffffffffffee0 != pQVar8) {
      local_d9 = 0;
      goto LAB_00281988;
    }
    QOrderedMutexLocker::QOrderedMutexLocker
              (in_stack_fffffffffffffef0,
               (QBasicMutex *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (QBasicMutex *)in_stack_fffffffffffffee0);
    bVar2 = QFileSystemEngine::isCaseSensitive(&pQVar7->dirEntry,&(pQVar7->fileCache).metaData);
    in_stack_fffffffffffffef8 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffef8);
    bVar3 = QFileSystemEngine::isCaseSensitive(&this->dirEntry,&(this->fileCache).metaData);
    if (bVar2 == bVar3) {
      uVar10 = (uint)((in_stack_fffffffffffffef8 & 0x1000000) != 0);
    }
    else {
      local_d9 = 0;
    }
    uVar9 = (uint)(bVar2 != bVar3);
    QOrderedMutexLocker::~QOrderedMutexLocker((QOrderedMutexLocker *)0x281625);
    if (uVar9 != 0) goto LAB_00281988;
  }
  bVar2 = operator==((QFlags<QDir::Filter>)
                     (pQVar7->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
                     super_QFlagsStorage<QDir::Filter>.i,
                     (QFlags<QDir::Filter>)
                     (this->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
                     super_QFlagsStorage<QDir::Filter>.i);
  if (((bVar2) &&
      (bVar2 = operator==((QFlags<QDir::SortFlag>)
                          (pQVar7->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
                          super_QFlagsStorage<QDir::SortFlag>.i,
                          (QFlags<QDir::SortFlag>)
                          (this->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
                          super_QFlagsStorage<QDir::SortFlag>.i), bVar2)) &&
     (cVar4 = QList<QString>::operator==
                        ((QList<QString> *)CONCAT44(uVar10,in_stack_fffffffffffffef8),
                         (QList<QString> *)in_stack_fffffffffffffef0), cVar4)) {
    QFileSystemEntry::filePath(in_stack_fffffffffffffec8);
    QFileSystemEntry::filePath(in_stack_fffffffffffffec8);
    bVar2 = operator==((QString *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                       (QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QString::~QString((QString *)0x2817a5);
    QString::~QString((QString *)0x2817b2);
    if (bVar2) {
      local_d9 = 1;
    }
    else {
      bVar2 = QDir::exists((QDir *)0x2817f4);
      if (bVar2) {
        bVar2 = QDir::exists((QDir *)0x281807);
        if (bVar2) {
          QDir::canonicalPath((QDir *)in_stack_fffffffffffffee0);
          QDir::canonicalPath((QDir *)in_stack_fffffffffffffee0);
          iVar6 = QString::compare(&in_stack_fffffffffffffec8->m_filePath,
                                   (QString *)
                                   CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                                   in_stack_fffffffffffffebc);
          local_d9 = iVar6 == 0;
          QString::~QString((QString *)0x28186d);
          QString::~QString((QString *)0x28187a);
        }
        else {
          local_d9 = 0;
        }
      }
      else {
        bVar2 = QDir::exists((QDir *)0x2818ad);
        if (bVar2) {
          local_d9 = 0;
        }
        else {
          this_00 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
          QDirPrivate::resolveAbsoluteEntry(this);
          QDirPrivate::resolveAbsoluteEntry(this);
          iVar6 = QString::compare(this_00,(QString *)
                                           CONCAT17(in_stack_fffffffffffffec7,
                                                    in_stack_fffffffffffffec0),
                                   in_stack_fffffffffffffebc);
          local_d9 = iVar6 == 0;
          QString::~QString((QString *)0x281953);
          QString::~QString((QString *)0x281960);
        }
      }
    }
  }
  else {
    local_d9 = 0;
  }
LAB_00281988:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(local_d9 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool comparesEqual(const QDir &lhs, const QDir &rhs)
{
    const QDirPrivate *d = lhs.d_ptr.constData();
    const QDirPrivate *other = rhs.d_ptr.constData();

    if (d == other)
        return true;
    Qt::CaseSensitivity sensitive;
    if (!d->fileEngine || !other->fileEngine) {
        if (d->fileEngine.get() != other->fileEngine.get()) // one is native, the other is a custom file-engine
            return false;

        QOrderedMutexLocker locker(&d->fileCache.mutex, &other->fileCache.mutex);
        const bool thisCaseSensitive = QFileSystemEngine::isCaseSensitive(d->dirEntry, d->fileCache.metaData);
        if (thisCaseSensitive != QFileSystemEngine::isCaseSensitive(other->dirEntry, other->fileCache.metaData))
            return false;

        sensitive = thisCaseSensitive ? Qt::CaseSensitive : Qt::CaseInsensitive;
    } else {
        if (d->fileEngine->caseSensitive() != other->fileEngine->caseSensitive())
            return false;
        sensitive = d->fileEngine->caseSensitive() ? Qt::CaseSensitive : Qt::CaseInsensitive;
    }

    if (d->filters == other->filters
       && d->sort == other->sort
       && d->nameFilters == other->nameFilters) {

        // Assume directories are the same if path is the same
        if (d->dirEntry.filePath() == other->dirEntry.filePath())
            return true;

        if (lhs.exists()) {
            if (!rhs.exists())
                return false; //can't be equal if only one exists
            // Both exist, fallback to expensive canonical path computation
            return lhs.canonicalPath().compare(rhs.canonicalPath(), sensitive) == 0;
        } else {
            if (rhs.exists())
                return false; //can't be equal if only one exists
            // Neither exists, compare absolute paths rather than canonical (which would be empty strings)
            QString thisFilePath = d->resolveAbsoluteEntry();
            QString otherFilePath = other->resolveAbsoluteEntry();
            return thisFilePath.compare(otherFilePath, sensitive) == 0;
        }
    }
    return false;
}